

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall
CLI::App::set_version_flag(App *this,string *flag_name,string *versionString,string *version_help)

{
  Option *pOVar1;
  string local_a0;
  anon_class_32_1_1f2bc529 local_80;
  function<void_()> local_60;
  string local_40;
  
  if (this->version_ptr_ != (Option *)0x0) {
    remove_option(this,this->version_ptr_);
    this->version_ptr_ = (Option *)0x0;
  }
  if (flag_name->_M_string_length == 0) {
    pOVar1 = (Option *)0x0;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)flag_name);
    ::std::__cxx11::string::string
              ((string *)&local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)versionString);
    ::std::function<void()>::
    function<CLI::App::set_version_flag(std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda()_1_,void>
              ((function<void()> *)&local_60,&local_80);
    ::std::__cxx11::string::string
              ((string *)&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)version_help);
    pOVar1 = add_flag_callback(this,&local_40,&local_60,&local_a0);
    this->version_ptr_ = pOVar1;
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_40);
    pOVar1 = this->version_ptr_;
    (pOVar1->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return pOVar1;
}

Assistant:

CLI11_INLINE Option *
App::set_version_flag(std::string flag_name, const std::string &versionString, const std::string &version_help) {
    // take flag_description by const reference otherwise add_flag tries to assign to version_description
    if(version_ptr_ != nullptr) {
        remove_option(version_ptr_);
        version_ptr_ = nullptr;
    }

    // Empty name will simply remove the version flag
    if(!flag_name.empty()) {
        version_ptr_ = add_flag_callback(
            flag_name, [versionString]() { throw(CLI::CallForVersion(versionString, 0)); }, version_help);
        version_ptr_->configurable(false);
    }

    return version_ptr_;
}